

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gecko::Graph::node_neighbors
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Graph *this,
          Index i)

{
  pointer pNVar1;
  long lVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar1 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)pNVar1[i - 1].arc;
  lVar2 = uVar3 * 4;
  for (; uVar3 < pNVar1[i].arc; uVar3 = uVar3 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,
               (value_type_conflict *)
               ((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar2));
    pNVar1 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = lVar2 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node::Index>
Graph::node_neighbors(Node::Index i) const
{
  std::vector<Node::Index> neighbor;
  for (Arc::Index a = node_begin(i); a < node_end(i); a++)
    neighbor.push_back(adj[a]);
  return neighbor;
}